

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O1

void __thiscall
ObjectFileDB::write_object_file_words(ObjectFileDB *this,string *output_dir,bool dump_v3_only)

{
  key_type *pkVar1;
  long lVar2;
  iterator iVar3;
  long *plVar4;
  int64_t iVar5;
  int64_t iVar6;
  size_type *psVar7;
  undefined7 in_register_00000011;
  uint uVar8;
  key_type *__k;
  char *__s;
  uint uVar9;
  long lVar10;
  string file_text;
  string file_name;
  Timer timer;
  string local_d8;
  string local_b8;
  key_type *local_98;
  ObjectFileDB *local_90;
  string local_88;
  string local_68;
  Timer local_48;
  
  __s = "- Writing object file dumps (all)...";
  if ((int)CONCAT71(in_register_00000011,dump_v3_only) != 0) {
    __s = "- Writing object file dumps (v3 only)...";
  }
  puts(__s);
  local_48._startTime.tv_sec = 0;
  local_48._startTime.tv_nsec = 0;
  Timer::start(&local_48);
  pkVar1 = (this->obj_file_order).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __k = (this->obj_file_order).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_90 = this;
  if ((this->obj_files_by_name)._M_h._M_element_count == (long)pkVar1 - (long)__k >> 5) {
    uVar9 = 0;
    uVar8 = 0;
    if (__k != pkVar1) {
      do {
        local_98 = pkVar1;
        iVar3 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)local_90,__k);
        if (iVar3.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_00121567;
        }
        lVar2 = *(long *)((long)iVar3.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
                                ._M_cur + 0x30);
        for (lVar10 = *(long *)((long)iVar3.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
                                      ._M_cur + 0x28); lVar10 != lVar2; lVar10 = lVar10 + 0x120) {
          if (*(int *)(lVar10 + 0x70) == 3 || !dump_v3_only) {
            LinkedObjectFile::print_words_abi_cxx11_(&local_b8,(LinkedObjectFile *)(lVar10 + 0x18));
            ObjectFileRecord::to_unique_name_abi_cxx11_
                      (&local_88,(ObjectFileRecord *)(lVar10 + 0xf0));
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            psVar7 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_d8.field_2._M_allocated_capacity = *psVar7;
              local_d8.field_2._8_8_ = plVar4[3];
            }
            else {
              local_d8.field_2._M_allocated_capacity = *psVar7;
              local_d8._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_d8._M_string_length = plVar4[1];
            *plVar4 = (long)psVar7;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            combine_path(&local_68,output_dir,&local_d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            uVar9 = uVar9 + (int)local_b8._M_string_length;
            write_text_file(&local_68,&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            uVar8 = uVar8 + 1;
          }
        }
        __k = __k + 1;
        pkVar1 = local_98;
      } while (__k != local_98);
    }
    puts("Wrote object file dumps:");
    printf(" total %d files\n",(ulong)uVar8);
    printf(" total %.3f MB\n",SUB84((double)((float)uVar9 * 9.536743e-07),0));
    iVar5 = Timer::getNs(&local_48);
    iVar6 = Timer::getNs(&local_48);
    printf(" total %.3f ms (%.3f MB/sec)\n",SUB84((double)iVar5 / 1000000.0,0),
           (double)uVar9 / (((double)iVar6 / 1000000000.0) * 1048576.0));
    putchar(10);
    return;
  }
LAB_00121567:
  __assert_fail("obj_files_by_name.size() == obj_file_order.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.h"
                ,0x3e,
                "void ObjectFileDB::for_each_obj(Func) [Func = (lambda at /workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp:278:16)]"
               );
}

Assistant:

void ObjectFileDB::write_object_file_words(const std::string& output_dir, bool dump_v3_only) {
  if (dump_v3_only) {
    printf("- Writing object file dumps (v3 only)...\n");
  } else {
    printf("- Writing object file dumps (all)...\n");
  }

  Timer timer;
  uint32_t total_bytes = 0, total_files = 0;

  for_each_obj([&](ObjectFileData& obj) {
    if (obj.linked_data.segments == 3 || !dump_v3_only) {
      auto file_text = obj.linked_data.print_words();
      auto file_name = combine_path(output_dir, obj.record.to_unique_name() + ".txt");
      total_bytes += file_text.size();
      write_text_file(file_name, file_text);
      total_files++;
    }
  });

  printf("Wrote object file dumps:\n");
  printf(" total %d files\n", total_files);
  printf(" total %.3f MB\n", total_bytes / ((float)(1u << 20u)));
  printf(" total %.3f ms (%.3f MB/sec)\n", timer.getMs(),
         total_bytes / ((1u << 20u) * timer.getSeconds()));
  printf("\n");
}